

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

InsertionResult * __thiscall
QHashPrivate::Data<QHashPrivate::Node<SubArray,_Macro>_>::findOrInsert<SubArray>
          (InsertionResult *__return_storage_ptr__,Data<QHashPrivate::Node<SubArray,_Macro>_> *this,
          SubArray *key)

{
  Span *pSVar1;
  bool bVar2;
  size_t hash;
  ulong uVar3;
  char *pcVar4;
  QLatin1StringView key_00;
  Bucket BVar5;
  size_t *local_38;
  
  pcVar4 = (key->array).d.ptr;
  if (pcVar4 == (char *)0x0) {
    pcVar4 = "";
  }
  key_00.m_data = pcVar4 + key->from;
  key_00.m_size = key->len;
  hash = qHash(key_00,this->seed);
  if (this->numBuckets == 0) {
    uVar3 = this->size;
LAB_0011f9a1:
    rehash(this,uVar3 + 1);
    BVar5 = findBucketWithHash<SubArray>(this,key,hash);
  }
  else {
    BVar5 = findBucketWithHash<SubArray>(this,key,hash);
    bVar2 = true;
    if ((BVar5.span)->offsets[BVar5.index] != 0xff) goto LAB_0011f9d4;
    uVar3 = this->size;
    if (this->numBuckets >> 1 <= uVar3) goto LAB_0011f9a1;
  }
  local_38 = &this->size;
  Span<QHashPrivate::Node<SubArray,_Macro>_>::insert(BVar5.span,BVar5.index);
  *local_38 = *local_38 + 1;
  bVar2 = false;
LAB_0011f9d4:
  pSVar1 = this->spans;
  (__return_storage_ptr__->it).d = this;
  (__return_storage_ptr__->it).bucket =
       ((ulong)((long)BVar5.span - (long)pSVar1) >> 4) * 0x1c71c71c71c71c80 | BVar5.index;
  __return_storage_ptr__->initialized = bVar2;
  return __return_storage_ptr__;
}

Assistant:

InsertionResult findOrInsert(const K &key) noexcept
    {
        Bucket it(static_cast<Span *>(nullptr), 0);
        size_t hash = QHashPrivate::calculateHash(key, seed);
        if (numBuckets > 0) {
            it = findBucketWithHash(key, hash);
            if (!it.isUnused())
                return { it.toIterator(this), true };
        }
        if (shouldGrow()) {
            rehash(size + 1);
            it = findBucketWithHash(key, hash); // need to get a new iterator after rehashing
        }
        Q_ASSERT(it.span != nullptr);
        Q_ASSERT(it.isUnused());
        it.insert();
        ++size;
        return { it.toIterator(this), false };
    }